

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall HighsSparseMatrix::setFormat(HighsSparseMatrix *this,MatrixFormat desired_format)

{
  int in_ESI;
  HighsSparseMatrix *in_stack_000000c0;
  
  if (in_ESI == 1) {
    ensureColwise(in_stack_000000c0);
  }
  else {
    ensureRowwise(in_stack_000000c0);
  }
  return;
}

Assistant:

void HighsSparseMatrix::setFormat(const MatrixFormat desired_format) {
  assert(this->formatOk());
  if (desired_format == MatrixFormat::kColwise) {
    this->ensureColwise();
  } else {
    this->ensureRowwise();
  }
  assert(this->format_ == desired_format);
}